

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerPoll.cpp
# Opt level: O3

void __thiscall Liby::PollerPoll::loop_once(PollerPoll *this,Timestamp *ts)

{
  ushort uVar1;
  pollfd *__fds;
  Channel *pCVar2;
  pointer ppVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  Timestamp now;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  Poller::runNextLoopHandlers(&this->super_Poller);
  if (ts == (Timestamp *)0x0) {
    iVar6 = -1;
  }
  else {
    local_58._M_unused._M_object = (PollerPoll *)0x0;
    local_58._8_8_ = 0;
    gettimeofday((timeval *)&local_58,(__timezone_ptr_t)0x0);
    lVar7 = (ts->tv_).tv_sec;
    iVar6 = 0;
    if ((long)local_58._M_unused._0_8_ <= lVar7) {
      if (lVar7 - local_58._0_8_ == 0 || lVar7 < (long)local_58._M_unused._0_8_) {
        lVar5 = (ts->tv_).tv_usec;
        iVar6 = 0;
        if (lVar5 < (long)local_58._8_8_) goto LAB_00118042;
      }
      else {
        lVar5 = (ts->tv_).tv_usec;
      }
      lVar4 = lVar5 + 1000000;
      if ((long)local_58._8_8_ <= lVar5) {
        lVar4 = lVar5;
      }
      iVar6 = (int)(lVar7 - local_58._0_8_) - (uint)(lVar5 < (long)local_58._8_8_);
      lVar4 = lVar4 - local_58._8_8_;
      if (1000000 < (uint)lVar4) {
        iVar6 = iVar6 + (int)(lVar4 / 1000000);
        lVar4 = lVar4 % 1000000;
      }
      iVar6 = ((int)(SUB168(SEXT816(lVar4) * SEXT816(0x20c49ba5e353f7cf),8) >> 7) -
              (SUB164(SEXT816(lVar4) * SEXT816(0x20c49ba5e353f7cf),0xc) >> 0x1f)) + iVar6 * 1000;
    }
  }
LAB_00118042:
  __fds = (pollfd *)
          (this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar6 = poll(__fds,(long)(this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)__fds >> 3,iVar6);
  ppVar3 = (this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
       super__Vector_impl_data._M_finish != ppVar3) && (0 < iVar6)) {
    uVar9 = 1;
    do {
      local_40 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerPoll.cpp:76:33)>
                 ::_M_invoke;
      local_58._8_8_ = 0;
      local_48 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerPoll.cpp:76:33)>
                 ::_M_manager;
      lVar7 = (long)ppVar3[uVar9 - 1].fd;
      local_58._M_unused._M_object = this;
      if ((-1 < lVar7) &&
         (pCVar2 = (this->super_Poller).channels_.
                   super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7], pCVar2 != (Channel *)0x0)) {
        uVar1 = ppVar3[uVar9 - 1].revents;
        if ((uVar1 & 0x2008) == 0) {
          bVar10 = (uVar1 & 1) != 0;
          if (bVar10) {
            Channel::handleReadEvent(pCVar2);
          }
          uVar8 = (uint)bVar10;
          if (((uVar1 & 4) != 0) &&
             (pCVar2 = (this->super_Poller).channels_.
                       super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar7], pCVar2 != (Channel *)0x0)) {
            uVar8 = 1;
            Channel::handleWritEvent(pCVar2);
          }
          iVar6 = iVar6 - uVar8;
        }
        else {
          Channel::handleErroEvent(pCVar2);
        }
      }
      DeferCaller::~DeferCaller((DeferCaller *)&local_58);
      ppVar3 = (this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while ((uVar9 < (ulong)((long)(this->pollfds_).
                                    super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppVar3 >> 3)) &&
            (uVar9 = uVar9 + 1, 0 < iVar6));
  }
  Poller::runAfterLoopHandlers(&this->super_Poller);
  return;
}

Assistant:

void PollerPoll::loop_once(Timestamp *ts) {
    runNextLoopHandlers();

    int interMs = -1;
    if (ts != nullptr) {
        Timestamp now = Timestamp::now();
        if (*ts < now) {
            interMs = 0;
        } else {
            interMs = static_cast<int>((*ts - now).toMillSec());
        }
    }

    int nready = ::poll(&pollfds_[0], pollfds_.size(), interMs);

    for (decltype(pollfds_.size()) i = 0; i < pollfds_.size() && nready > 0;
         i++) {
        DeferCaller deferCaller([this] { runNextTickHandlers(); });

        bool flag = false;
        int fd = pollfds_[i].fd;
        int revent = pollfds_[i].revents;
        Channel *ch;

        if (fd < 0 || (ch = getChannel(fd)) == nullptr)
            continue;

        if (revent & POLLERR
#ifdef __linux__
            || revent & POLLRDHUP
#endif
            ) {
            flag = true;
            ch->handleErroEvent();
            continue;
        }

        // readEventHandler可能会将ch析构,所以简单的改了一下逻辑
        if (revent & POLLIN) {
            flag = true;
            ch->handleReadEvent();
        }

        if (revent & POLLOUT && (ch = getChannel(fd)) != nullptr) {
            flag = true;
            ch->handleWritEvent();
        }

        if (flag == true) {
            nready--;
        }
    }

    runAfterLoopHandlers();
}